

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

Gia_Man_t * Ifn_ManStrFindModel(Ifn_Ntk_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  void *__s;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  long lVar7;
  int *piVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar13;
  size_t __size;
  long lVar14;
  int pVarsData [256];
  int local_438 [258];
  ulong uVar12;
  
  __size = (long)p->nParsVIni << 2;
  __s = malloc(__size);
  memset(__s,0xff,__size);
  p_00 = Gia_ManStart(1000);
  pcVar4 = (char *)malloc(6);
  builtin_strncpy(pcVar4,"model",6);
  p_00->pName = pcVar4;
  Gia_ManHashStart(p_00);
  if (0 < p->nInps) {
    lVar10 = 0;
    do {
      pGVar5 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar5;
      *(ulong *)pGVar5 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar5 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar1 = p_00->pObjs;
      if ((pGVar5 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar5)) goto LAB_003a7112;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar5 - (long)pGVar1) >> 2) * -0x55555555);
      pGVar1 = p_00->pObjs;
      if ((pGVar5 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar5)) goto LAB_003a7112;
      *(int *)((long)__s + lVar10 * 4) =
           (int)((ulong)((long)pGVar5 - (long)pGVar1) >> 2) * 0x55555556;
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->nInps);
  }
  lVar10 = (long)p->nObjs;
  if (p->nObjs < p->nParsVIni) {
    do {
      pGVar5 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar5;
      *(ulong *)pGVar5 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar5 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar1 = p_00->pObjs;
      if ((pGVar5 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar5)) {
LAB_003a7112:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar5 - (long)pGVar1) >> 2) * -0x55555555);
      pGVar1 = p_00->pObjs;
      if ((pGVar5 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar5)) goto LAB_003a7112;
      *(int *)((long)__s + lVar10 * 4) =
           (int)((ulong)((long)pGVar5 - (long)pGVar1) >> 2) * 0x55555556;
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->nParsVIni);
  }
  lVar10 = (long)p->nInps;
  iVar3 = p->nObjs;
  if (p->nInps < iVar3) {
    piVar8 = p->Nodes[lVar10].Fanins;
    do {
      uVar2 = *(uint *)(p->Nodes + lVar10);
      if (3 < (uVar2 & 7) - 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x219,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
      }
      uVar11 = uVar2 >> 3 & 0x1f;
      uVar12 = (ulong)uVar11;
      switch(uVar2 & 7) {
      case 3:
        if (uVar11 == 0) {
          iVar3 = 1;
        }
        else {
          iVar3 = 1;
          uVar13 = 0;
          do {
            iVar3 = Gia_ManHashAnd(p_00,iVar3,*(int *)((long)__s + (long)piVar8[uVar13] * 4));
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        *(int *)((long)__s + lVar10 * 4) = iVar3;
        break;
      case 4:
        if (uVar11 == 0) {
          iVar3 = 0;
        }
        else {
          uVar13 = 0;
          iVar3 = 0;
          do {
            iVar3 = Gia_ManHashXor(p_00,iVar3,*(int *)((long)__s + (long)piVar8[uVar13] * 4));
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        *(int *)((long)__s + lVar10 * 4) = iVar3;
        break;
      case 5:
        if (uVar11 != 3) {
          __assert_fail("nFans == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                        ,0x209,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
        }
        iVar3 = Gia_ManHashMux(p_00,*(int *)((long)__s + (long)p->Nodes[lVar10].Fanins[0] * 4),
                               *(int *)((long)__s + (long)p->Nodes[lVar10].Fanins[1] * 4),
                               *(int *)((long)__s + (long)p->Nodes[lVar10].Fanins[2] * 4));
        *(int *)((long)__s + lVar10 * 4) = iVar3;
        break;
      case 6:
        uVar9 = 1 << (sbyte)uVar11;
        if (8 < uVar11) {
          __assert_fail("nFans >= 0 && nFans <= 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                        ,0x210,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
        }
        memcpy(local_438,(void *)((long)__s + (ulong)(uVar2 >> 8 & 0xff) * 4),
               (ulong)(uint)(4 << (sbyte)uVar11));
        if (uVar11 == 0) {
          uVar2 = 1;
        }
        else {
          uVar2 = 1;
          uVar13 = 0;
          do {
            lVar7 = (long)(int)uVar2;
            uVar2 = uVar2 * 2;
            lVar14 = 0;
            do {
              iVar3 = Gia_ManHashMux(p_00,*(int *)((long)__s +
                                                  (long)p->Nodes[lVar10].Fanins[uVar13] * 4),
                                     local_438[lVar7 + lVar14],local_438[lVar14]);
              local_438[lVar14] = iVar3;
              lVar14 = lVar14 + (int)uVar2;
            } while (lVar14 < (long)(ulong)uVar9);
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar12);
        }
        if (uVar2 != uVar9) {
          __assert_fail("Step == nMints",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                        ,0x216,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
        }
        *(int *)((long)__s + lVar10 * 4) = local_438[0];
      }
      lVar10 = lVar10 + 1;
      iVar3 = p->nObjs;
      piVar8 = piVar8 + 0xc;
    } while (lVar10 < iVar3);
  }
  Gia_ManAppendCo(p_00,*(int *)((long)__s + (long)iVar3 * 4 + -4));
  if (__s != (void *)0x0) {
    free(__s);
  }
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  if (pGVar6->vCis->nSize - pGVar6->nRegs != (p->nParsVIni - p->nObjs) + p->nInps) {
    __assert_fail("Gia_ManPiNum(pNew) == p->nParsVIni - (p->nObjs - p->nInps)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                  ,0x21f,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
  }
  if (pGVar6->vCos->nSize - pGVar6->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(pNew) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                  ,0x220,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
  }
  return pGVar6;
}

Assistant:

Gia_Man_t * Ifn_ManStrFindModel( Ifn_Ntk_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    int i, k, iLit, * pVarMap = ABC_FALLOC( int, p->nParsVIni );
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "model" );
    Gia_ManHashStart( pNew );
    for ( i = 0; i < p->nInps; i++ )
        pVarMap[i] = Gia_ManAppendCi(pNew);
    for ( i = p->nObjs; i < p->nParsVIni; i++ )
        pVarMap[i] = Gia_ManAppendCi(pNew);
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int Type = p->Nodes[i].Type;
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        int iFanin = p->Nodes[i].iFirst;
        if ( Type == IFN_DSD_AND )
        {
            iLit = 1;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashAnd( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_XOR )
        {
            iLit = 0;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashXor( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_MUX )
        {
            assert( nFans == 3 );
            pVarMap[i] = Gia_ManHashMux( pNew, pVarMap[pFans[0]], pVarMap[pFans[1]], pVarMap[pFans[2]] );
        }
        else if ( Type == IFN_DSD_PRIME )
        {
            int n, Step, pVarsData[256];
            int nMints = (1 << nFans);
            assert( nFans >= 0 && nFans <= 8 );
            for ( k = 0; k < nMints; k++ )
                pVarsData[k] = pVarMap[iFanin + k];
            for ( Step = 1, k = 0; k < nFans; k++, Step <<= 1 )
                for ( n = 0; n < nMints; n += Step << 1 )
                    pVarsData[n] = Gia_ManHashMux( pNew, pVarMap[pFans[k]], pVarsData[n+Step], pVarsData[n] );
            assert( Step == nMints );
            pVarMap[i] = pVarsData[0];
        }
        else assert( 0 );
    }
    Gia_ManAppendCo( pNew, pVarMap[p->nObjs-1] );
    ABC_FREE( pVarMap );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == p->nParsVIni - (p->nObjs - p->nInps) );
    assert( Gia_ManPoNum(pNew) == 1 );
    return pNew;
}